

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

void __thiscall
Assimp::SMDImporter::ParseNodeInfo(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  SMDImporter *this_00;
  pointer pBVar7;
  ulong uVar8;
  byte *pbVar9;
  byte *local_58;
  SMDImporter *local_50 [2];
  _func_int **local_40;
  
  this->iLineNumber = this->iLineNumber + 1;
  while ((uVar4 = (ulong)(byte)*szCurrent, pbVar3 = (byte *)szCurrent, uVar4 < 0x21 &&
         ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0))) {
    szCurrent = (char *)((byte *)szCurrent + 1);
  }
  while ((byte)uVar4 < 0x21) {
    if ((0x100000200U >> (uVar4 & 0x3f) & 1) == 0) {
      if ((0x3401UL >> (uVar4 & 0x3f) & 1) != 0) goto LAB_005d0b1e;
      break;
    }
    uVar4 = (ulong)pbVar3[1];
    pbVar3 = pbVar3 + 1;
  }
  uVar6 = 0;
  if (0xf5 < (byte)((byte)uVar4 - 0x3a)) {
    uVar6 = 0;
    do {
      uVar6 = (uint)(byte)((char)uVar4 - 0x30) + uVar6 * 10;
      pbVar9 = pbVar3 + 1;
      uVar4 = (ulong)*pbVar9;
      pbVar3 = pbVar3 + 1;
    } while (0xf5 < (byte)(*pbVar9 - 0x3a));
  }
  for (; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
  }
  bVar5 = *pbVar3;
  if ((0xd < bVar5) || (szCurrent = (char *)pbVar3, (0x3401U >> (bVar5 & 0x1f) & 1) == 0)) {
    uVar8 = (ulong)uVar6;
    pBVar7 = (this->asBones).
             super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->asBones).
                   super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl
                   .super__Vector_impl_data._M_finish - (long)pBVar7 >> 4) * -0x71c71c71c71c71c7;
    local_58 = pbVar3;
    if (uVar4 < uVar8 || uVar4 - uVar8 == 0) {
      std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::resize
                (&this->asBones,(ulong)(uVar6 + 1));
      pBVar7 = (this->asBones).
               super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar5 = *pbVar3;
    }
    if (bVar5 == 0x22) {
      pbVar3 = pbVar3 + 1;
      local_58 = pbVar3;
    }
    else {
      LogWarning(this,"Bone name is expcted to be enclosed in double quotation marks. ");
    }
    uVar6 = 0;
    pbVar9 = pbVar3;
    do {
      bVar1 = *pbVar9;
      if (bVar5 == 0x22) {
        if (bVar1 == 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone name");
          local_58 = pbVar3;
          while( true ) {
            bVar5 = *local_58;
            if ((bVar5 < 0xe) && ((0x2401U >> (bVar5 & 0x1f) & 1) != 0)) break;
            local_58 = local_58 + 1;
          }
          while ((bVar5 == 0xd || (bVar5 == 10))) {
            pbVar3 = local_58 + 1;
            local_58 = local_58 + 1;
            bVar5 = *pbVar3;
          }
          goto LAB_005d0b58;
        }
        if (bVar1 == 0x22) goto LAB_005d0cb2;
      }
      else if ((bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
      goto LAB_005d0cb5;
      pbVar9 = pbVar9 + 1;
      uVar6 = uVar6 + 1;
    } while( true );
  }
LAB_005d0b1e:
  local_58 = (byte *)szCurrent;
  LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone index");
  local_58 = (byte *)szCurrent;
  while( true ) {
    bVar5 = *local_58;
    if ((bVar5 < 0xe) && ((0x2401U >> (bVar5 & 0x1f) & 1) != 0)) break;
    local_58 = local_58 + 1;
  }
  while ((bVar5 == 0xd || (bVar5 == 10))) {
    pbVar3 = local_58 + 1;
    local_58 = local_58 + 1;
    bVar5 = *pbVar3;
  }
LAB_005d0b58:
  this->iLineNumber = this->iLineNumber + 1;
  *szCurrentOut = (char *)local_58;
  return;
LAB_005d0cb2:
  pbVar9 = pbVar9 + 1;
LAB_005d0cb5:
  local_50[0] = (SMDImporter *)&stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pbVar3,pbVar3 + uVar6);
  std::__cxx11::string::operator=((string *)(pBVar7 + uVar8),(string *)local_50);
  this_00 = local_50[0];
  if (local_50[0] != (SMDImporter *)&stack0xffffffffffffffc0) {
    operator_delete(local_50[0],(long)local_40 + 1);
  }
  local_58 = pbVar9;
  bVar2 = ParseSignedInt(this_00,(char *)pbVar9,(char **)&local_58,(int *)&pBVar7[uVar8].iParent);
  if (bVar2) {
    while( true ) {
      bVar5 = *local_58;
      if ((bVar5 < 0xe) && ((0x2401U >> (bVar5 & 0x1f) & 1) != 0)) break;
      local_58 = local_58 + 1;
    }
    while ((bVar5 == 0xd || (bVar5 == 10))) {
      pbVar3 = local_58 + 1;
      local_58 = local_58 + 1;
      bVar5 = *pbVar3;
    }
  }
  else {
    LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone parent index. Assuming -1");
    while( true ) {
      bVar5 = *local_58;
      if ((bVar5 < 0xe) && ((0x2401U >> (bVar5 & 0x1f) & 1) != 0)) break;
      local_58 = local_58 + 1;
    }
    while ((bVar5 == 0xd || (bVar5 == 10))) {
      pbVar3 = local_58 + 1;
      local_58 = local_58 + 1;
      bVar5 = *pbVar3;
    }
  }
  goto LAB_005d0b58;
}

Assistant:

void SMDImporter::ParseNodeInfo(const char* szCurrent, const char** szCurrentOut) {
    unsigned int iBone  = 0;
    SkipSpacesAndLineEnd(szCurrent,&szCurrent);
    if ( !ParseUnsignedInt(szCurrent,&szCurrent,iBone) || !SkipSpaces(szCurrent,&szCurrent)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone index");
        SMDI_PARSE_RETURN;
    }
    // add our bone to the list
    if (iBone >= asBones.size()) {
        asBones.resize(iBone+1);
    }
    SMD::Bone& bone = asBones[iBone];

    bool bQuota = true;
    if ('\"' != *szCurrent) {
        LogWarning("Bone name is expcted to be enclosed in "
            "double quotation marks. ");
        bQuota = false;
    } else {
        ++szCurrent;
    }

    const char* szEnd = szCurrent;
    for ( ;; ) {
        if (bQuota && '\"' == *szEnd) {
            iBone = (unsigned int)(szEnd - szCurrent);
            ++szEnd;
            break;
        } else if (!bQuota && IsSpaceOrNewLine(*szEnd)) {
            iBone = (unsigned int)(szEnd - szCurrent);
            break;
        } else if (!(*szEnd)) {
            LogErrorNoThrow("Unexpected EOF/EOL while parsing bone name");
            SMDI_PARSE_RETURN;
        }
        ++szEnd;
    }
    bone.mName = std::string(szCurrent,iBone);
    szCurrent = szEnd;

    // the only negative bone parent index that could occur is -1 AFAIK
    if(!ParseSignedInt(szCurrent,&szCurrent,(int&)bone.iParent))  {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone parent index. Assuming -1");
        SMDI_PARSE_RETURN;
    }

    // go to the beginning of the next line
    SMDI_PARSE_RETURN;
}